

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O2

void Abc_NtkPrintMiniMapping(int *pArray)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *__s;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  
  uVar1 = *pArray;
  uVar9 = (ulong)uVar1;
  uVar6 = pArray[1];
  uVar5 = pArray[2];
  uVar4 = 0;
  printf("Mapped network has %d CIs, %d COs, %d gates, and %d flops.\n",uVar9,(ulong)uVar6,
         (ulong)uVar5,(ulong)(uint)pArray[3]);
  printf("The first %d object IDs (from 0 to %d) are reserved for the CIs.\n",(ulong)uVar1,
         (ulong)(uVar1 - 1));
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  iVar7 = 4;
  while( true ) {
    lVar10 = (long)iVar7;
    if (uVar4 == uVar5) break;
    printf("Node %d has fanins {",(ulong)(uVar4 + uVar1));
    iVar2 = pArray[lVar10];
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    for (lVar11 = 0; (iVar2 + iVar7) - lVar10 != lVar11; lVar11 = lVar11 + 1) {
      printf(" %d",(ulong)(uint)pArray[lVar10 + lVar11 + 1]);
    }
    iVar7 = iVar7 + (int)lVar11 + 1;
    puts(" }");
    uVar4 = uVar4 + 1;
  }
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  lVar11 = lVar10 << 0x20;
  for (uVar8 = 0; uVar6 != (uint)uVar8; uVar8 = uVar8 + 1) {
    printf("CO %d is driven by node %d\n",uVar8 & 0xffffffff,(ulong)(uint)pArray[lVar10 + uVar8]);
    lVar11 = lVar11 + 0x100000000;
  }
  __s = (char *)((long)pArray + (lVar11 >> 0x1e));
  while (bVar12 = uVar5 != 0, uVar5 = uVar5 - 1, bVar12) {
    sVar3 = strlen(__s);
    printf("Node %d has gate \"%s\"\n",uVar9,__s);
    uVar9 = (ulong)((int)uVar9 + 1);
    __s = __s + sVar3 + 1;
  }
  return;
}

Assistant:

void Abc_NtkPrintMiniMapping( int * pArray )
{
    int nCis, nCos, nNodes, nFlops;
    int i, k, nLeaves, Pos = 4;
    char * pBuffer, * pName;
    nCis = pArray[0];
    nCos = pArray[1];
    nNodes = pArray[2];
    nFlops = pArray[3];
    printf( "Mapped network has %d CIs, %d COs, %d gates, and %d flops.\n", nCis, nCos, nNodes, nFlops );
    printf( "The first %d object IDs (from 0 to %d) are reserved for the CIs.\n", nCis, nCis - 1 );
    for ( i = 0; i < nNodes; i++ )
    {
        printf( "Node %d has fanins {", nCis + i );
        nLeaves = pArray[Pos++];
        for ( k = 0; k < nLeaves; k++ )
            printf( " %d", pArray[Pos++] );
        printf( " }\n" );
    }
    for ( i = 0; i < nCos; i++ )
        printf( "CO %d is driven by node %d\n", i, pArray[Pos++] );
    pBuffer = (char *)(pArray + Pos);
    for ( i = 0; i < nNodes; i++ )
    {
        pName = pBuffer;
        pBuffer += strlen(pName) + 1;
        printf( "Node %d has gate \"%s\"\n", nCis + i, pName );
    }
}